

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData160 *
cfd::core::HashUtil::Ripemd160
          (ByteData160 *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  uchar *bytes_00;
  size_type bytes_len;
  uchar *bytes_out;
  size_type len;
  CfdException *this;
  allocator local_81;
  string local_80;
  CfdSourceLocation local_60;
  int local_48 [2];
  int ret;
  allocator<unsigned_char> local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes_local;
  ByteData160 *byte160;
  
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)bytes;
  ::std::allocator<unsigned_char>::allocator(&local_31);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x14,&local_31);
  ::std::allocator<unsigned_char>::~allocator(&local_31);
  bytes_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  bytes_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  local_48[0] = wally_ripemd160(bytes_00,bytes_len,bytes_out,len);
  if (local_48[0] == 0) {
    ByteData160::ByteData160
              (__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    return __return_storage_ptr__;
  }
  local_60.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
               ,0x2f);
  local_60.filename = local_60.filename + 1;
  local_60.line = 0xb5;
  local_60.funcname = "Ripemd160";
  logger::warn<int&>(&local_60,"wally_hash160 NG[{}].",local_48);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_80,"hash160 calc error.",&local_81);
  CfdException::CfdException(this,kCfdIllegalStateError,&local_80);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData160 HashUtil::Ripemd160(const std::vector<uint8_t> &bytes) {
  std::vector<uint8_t> output(RIPEMD160_LEN);
  int ret = wally_ripemd160(
      bytes.data(), bytes.size(), output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_hash160 NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "hash160 calc error.");
  }

  ByteData160 byte160(output);
  return byte160;
}